

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HashBlock * sha256(HashBlock *__return_storage_ptr__,string *message)

{
  pointer *__return_storage_ptr___00;
  bool bVar1;
  int message_size;
  char *message_00;
  reference __x;
  reference pbVar2;
  unsigned_long uVar3;
  ostream *this;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  local_d0;
  _Base_bitset<1UL> local_b8;
  bitset<32UL> wi;
  iterator __end2;
  iterator __begin2;
  vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *__range2;
  vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> w;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  *__range1;
  vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> local_58;
  undefined1 local_40 [8];
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ws;
  vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> blocks;
  string *message_local;
  
  message_00 = (char *)std::__cxx11::string::c_str();
  message_size = std::__cxx11::string::size();
  __return_storage_ptr___00 =
       &ws.
        super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pad_parse((vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *)
            __return_storage_ptr___00,message_00,message_size);
  std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::vector
            (&local_58,
             (vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *)
             __return_storage_ptr___00);
  expand((vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
          *)local_40,&local_58);
  std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::~vector(&local_58);
  __end1 = std::
           vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
           ::begin((vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
                    *)local_40);
  w.super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
                ::end((vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
                       *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_*,_std::vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>_>
                                *)&w.
                                   super__Vector_base<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_*,_std::vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>_>
          ::operator*(&__end1);
    std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::vector
              ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)&__range2,__x);
    __end2 = std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::begin
                       ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)&__range2)
    ;
    wi.super__Base_bitset<1UL>._M_w =
         (_Base_bitset<1UL>)
         std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::end
                   ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)&__range2);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::bitset<32UL>_*,_std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>
                                  *)&wi);
      if (!bVar1) break;
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::bitset<32UL>_*,_std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>
               ::operator*(&__end2);
      local_b8._M_w = (pbVar2->super__Base_bitset<1UL>)._M_w;
      uVar3 = std::bitset<32UL>::to_ulong((bitset<32UL> *)&local_b8);
      this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<std::bitset<32UL>_*,_std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>
      ::operator++(&__end2);
    }
    std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>::~vector
              ((vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_> *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_*,_std::vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::vector(&local_d0,
           (vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
            *)local_40);
  compress(__return_storage_ptr__,&local_d0);
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::~vector(&local_d0);
  std::
  vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
  ::~vector((vector<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
             *)local_40);
  std::vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_>::~vector
            ((vector<std::bitset<512UL>,_std::allocator<std::bitset<512UL>_>_> *)
             &ws.
              super__Vector_base<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>,_std::allocator<std::vector<std::bitset<32UL>,_std::allocator<std::bitset<32UL>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

HashBlock sha256(string message) {
    auto blocks = pad_parse(message.c_str(), message.size());

    auto ws = expand(blocks);
    for (auto w:ws)
    {
        for (auto wi: w)
        {
            cout << wi.to_ulong() << endl;
        }
    }


    return compress(ws);
}